

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O0

SchemaCatalogEntry * __thiscall
duckdb::Binder::BindCreateFunctionInfo(Binder *this,CreateInfo *info)

{
  bool bVar1;
  uint uVar2;
  pointer pPVar3;
  pointer pMVar4;
  undefined8 uVar5;
  pointer ptr_p;
  SchemaCatalogEntry *pSVar6;
  undefined1 uVar7;
  long in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar8;
  exception *ex;
  ErrorData error;
  bool should_create_dependencies;
  SelectBinder binder;
  BoundGroupInformation group_info;
  BoundSelectNode sel_node;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  expression;
  templated_unique_single_t this_macro_binding;
  ConstantExpression *val;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>
  *entry;
  iterator __end2_1;
  iterator __begin2_1;
  case_insensitive_map_t<unique_ptr<ParsedExpression>_> *__range2_1;
  ColumnRefExpression param;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *param_expr;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *__range2;
  size_type parameter_count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  dummy_names;
  vector<duckdb::LogicalType,_true> dummy_types;
  ScalarMacroFunction *scalar_function;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *function;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  *__range1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  positional_parameters;
  DBConfig *db_config;
  Catalog *catalog;
  LogicalDependencyList *dependencies;
  CreateMacroInfo *base;
  ErrorData *in_stack_fffffffffffff608;
  BoundSelectNode *in_stack_fffffffffffff610;
  BoundSelectNode *in_stack_fffffffffffff618;
  allocator *paVar9;
  ClientContext *in_stack_fffffffffffff620;
  undefined7 in_stack_fffffffffffff628;
  undefined1 in_stack_fffffffffffff62f;
  SelectBinder *in_stack_fffffffffffff630;
  ErrorData *in_stack_fffffffffffff648;
  undefined7 in_stack_fffffffffffff650;
  undefined1 in_stack_fffffffffffff657;
  ClientContext *in_stack_fffffffffffff658;
  undefined7 in_stack_fffffffffffff660;
  undefined1 in_stack_fffffffffffff667;
  ColumnRefExpression *in_stack_fffffffffffff668;
  ClientContext *in_stack_fffffffffffff670;
  string *in_stack_fffffffffffff678;
  ConstantExpression *in_stack_fffffffffffff680;
  string *in_stack_fffffffffffff688;
  pointer in_stack_fffffffffffff690;
  string *in_stack_fffffffffffff698;
  undefined7 in_stack_fffffffffffff6d0;
  allocator local_8c1;
  string local_8c0 [7];
  undefined1 in_stack_fffffffffffff747;
  idx_t in_stack_fffffffffffff748;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_fffffffffffff750;
  ExpressionBinder *in_stack_fffffffffffff758;
  allocator local_811;
  string local_810 [160];
  ErrorData local_770;
  LogicalDependencyList *local_6f0;
  Catalog *local_6e8;
  undefined1 local_6e0 [1136];
  undefined1 local_270 [8];
  optional_ptr<duckdb::DummyBinding,_true> local_268 [2];
  ConstantExpression *local_258;
  reference local_250;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
  local_248;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
  local_240;
  case_insensitive_map_t<unique_ptr<ParsedExpression>_> *local_238;
  undefined1 local_229;
  allocator local_201;
  string local_200 [112];
  reference local_190;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_188;
  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
  local_180;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *local_178;
  _Node_iterator_base<unsigned_long,_false> local_170;
  undefined1 local_168;
  undefined1 local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  _Node_iterator_base<unsigned_long,_false> local_110;
  _Node_iterator_base<unsigned_long,_false> local_108;
  size_type local_100;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [48];
  ScalarMacroFunction *local_90;
  reference local_88;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *local_80;
  __normal_iterator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>_>
  local_78;
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  *local_70;
  DBConfig *local_30;
  Catalog *local_28;
  LogicalDependencyList *local_20;
  CreateMacroInfo *local_18;
  
  local_18 = ParseInfo::Cast<duckdb::CreateMacroInfo>((ParseInfo *)in_stack_fffffffffffff610);
  local_20 = &(local_18->super_CreateFunctionInfo).super_CreateInfo.dependencies;
  local_28 = Catalog::GetCatalog(in_stack_fffffffffffff670,(string *)in_stack_fffffffffffff668);
  local_30 = DBConfig::GetConfig((ClientContext *)0xdcd63c);
  ::std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0xdcd651);
  local_70 = &local_18->macros;
  local_78._M_current =
       (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                *)in_stack_fffffffffffff608);
  local_80 = (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *)
             ::std::
             vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
             ::end((vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                    *)in_stack_fffffffffffff608);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>_>
                        *)in_stack_fffffffffffff610,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>_>
                        *)in_stack_fffffffffffff608);
    if (!bVar1) {
      pSVar6 = BindCreateSchema((Binder *)
                                CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
                                (CreateInfo *)in_stack_fffffffffffff658);
      ::std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0xdce413);
      return pSVar6;
    }
    local_88 = __gnu_cxx::
               __normal_iterator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>_>
               ::operator*(&local_78);
    unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::operator->
              ((unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                *)in_stack_fffffffffffff610);
    local_90 = MacroFunction::Cast<duckdb::ScalarMacroFunction>
                         ((MacroFunction *)
                          CONCAT17(in_stack_fffffffffffff657,in_stack_fffffffffffff650));
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)in_stack_fffffffffffff610);
    uVar2 = (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[6])();
    if ((uVar2 & 1) != 0) {
      local_c2 = 1;
      uVar5 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_c0,"Parameter expressions within macro\'s are not supported!",&local_c1);
      BinderException::BinderException
                ((BinderException *)in_stack_fffffffffffff610,(string *)in_stack_fffffffffffff608);
      local_c2 = 0;
      __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
    }
    vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xdcd85b);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)0xdcd868);
    pMVar4 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->((unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                         *)in_stack_fffffffffffff610);
    local_100 = ::std::
                vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ::size(&(pMVar4->parameters).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      );
    local_108._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::find((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)in_stack_fffffffffffff608,(key_type *)0xdcd8ad);
    local_110._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)in_stack_fffffffffffff608);
    bVar1 = ::std::__detail::operator!=(&local_108,&local_110);
    if (bVar1) {
      local_159 = 1;
      uVar5 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_130,
                 "Ambiguity in macro overloads - macro \"%s\" has multiple definitions with %llu parameters"
                 ,&local_131);
      ::std::__cxx11::string::string(local_158,(string *)&(local_18->super_CreateFunctionInfo).name)
      ;
      BinderException::BinderException<std::__cxx11::string,unsigned_long>
                ((BinderException *)in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff680,(unsigned_long)in_stack_fffffffffffff678);
      local_159 = 0;
      __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
    }
    pVar8 = ::std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)in_stack_fffffffffffff620,(value_type *)in_stack_fffffffffffff618);
    local_170._M_cur =
         (__node_type *)pVar8.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    uVar7 = pVar8.second;
    local_168 = uVar7;
    pMVar4 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->((unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                         *)in_stack_fffffffffffff610);
    local_178 = &pMVar4->parameters;
    local_180._M_current =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::begin((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     *)in_stack_fffffffffffff608);
    local_188 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)::std::
                   vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ::end((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          *)in_stack_fffffffffffff608);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffff610,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                               *)in_stack_fffffffffffff608), bVar1) {
      local_190 = __gnu_cxx::
                  __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                  ::operator*(&local_180);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffff610);
      BaseExpression::Cast<duckdb::ColumnRefExpression>
                ((BaseExpression *)CONCAT17(in_stack_fffffffffffff657,in_stack_fffffffffffff650));
      ColumnRefExpression::ColumnRefExpression
                ((ColumnRefExpression *)in_stack_fffffffffffff620,
                 (ColumnRefExpression *)in_stack_fffffffffffff618);
      bVar1 = ColumnRefExpression::IsQualified((ColumnRefExpression *)0xdcdb70);
      if (bVar1) {
        local_229 = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_200,"Invalid parameter name \'%s\': must be unqualified",&local_201);
        ColumnRefExpression::ToString_abi_cxx11_(in_stack_fffffffffffff668);
        BinderException::BinderException<std::__cxx11::string>
                  ((BinderException *)in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff670);
        local_229 = 0;
        __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
      }
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 in_stack_fffffffffffff620,(LogicalTypeId *)in_stack_fffffffffffff618);
      in_stack_fffffffffffff698 =
           ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)0xdcdcf2);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff620,(value_type *)in_stack_fffffffffffff618);
      ColumnRefExpression::~ColumnRefExpression((ColumnRefExpression *)in_stack_fffffffffffff610);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
      ::operator++(&local_180);
    }
    in_stack_fffffffffffff690 =
         unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
         operator->((unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                     *)in_stack_fffffffffffff610);
    local_238 = &in_stack_fffffffffffff690->default_parameters;
    local_240._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                  *)in_stack_fffffffffffff608);
    local_248._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                *)in_stack_fffffffffffff608);
    while (bVar1 = ::std::__detail::operator!=(&local_240,&local_248), bVar1) {
      local_250 = ::std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_false,_true>
                  ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_false,_true>
                               *)0xdcddc4);
      in_stack_fffffffffffff688 =
           (string *)
           unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)in_stack_fffffffffffff610);
      in_stack_fffffffffffff680 =
           BaseExpression::Cast<duckdb::ConstantExpression>
                     ((BaseExpression *)
                      CONCAT17(in_stack_fffffffffffff657,in_stack_fffffffffffff650));
      local_258 = in_stack_fffffffffffff680;
      in_stack_fffffffffffff678 = (string *)Value::type(&in_stack_fffffffffffff680->value);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 in_stack_fffffffffffff620,(value_type *)in_stack_fffffffffffff618);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff620,(value_type *)in_stack_fffffffffffff618);
      ::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_false,_true>
                    *)in_stack_fffffffffffff610);
    }
    make_uniq<duckdb::DummyBinding,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,std::__cxx11::string&>
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff698,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)in_stack_fffffffffffff690,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff688);
    ptr_p = ::std::unique_ptr<duckdb::DummyBinding,_std::default_delete<duckdb::DummyBinding>_>::get
                      ((unique_ptr<duckdb::DummyBinding,_std::default_delete<duckdb::DummyBinding>_>
                        *)in_stack_fffffffffffff610);
    optional_ptr<duckdb::DummyBinding,_true>::optional_ptr(local_268,ptr_p);
    *(DummyBinding **)(in_RDI + 0x1a8) = local_268[0].ptr;
    in_stack_fffffffffffff670 =
         (ClientContext *)
         unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     *)in_stack_fffffffffffff610);
    (*((BaseExpression *)
      &in_stack_fffffffffffff670->super_enable_shared_from_this<duckdb::ClientContext>)->
      _vptr_BaseExpression[0xc])(local_270);
    ExpressionBinder::QualifyColumnNames
              ((Binder *)CONCAT17(uVar7,in_stack_fffffffffffff6d0),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)pMVar4);
    BoundSelectNode::BoundSelectNode(in_stack_fffffffffffff610);
    in_stack_fffffffffffff668 = (ColumnRefExpression *)(local_6e0 + 0xb0);
    BoundGroupInformation::BoundGroupInformation((BoundGroupInformation *)in_stack_fffffffffffff610)
    ;
    SelectBinder::SelectBinder
              (in_stack_fffffffffffff630,
               (Binder *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628),
               in_stack_fffffffffffff620,in_stack_fffffffffffff618,
               (BoundGroupInformation *)in_stack_fffffffffffff610);
    in_stack_fffffffffffff667 =
         DBConfig::GetSetting<duckdb::EnableMacroDependenciesSetting>
                   ((DBConfig *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
                    in_stack_fffffffffffff658);
    local_6e0[0x27] = in_stack_fffffffffffff667;
    if ((bool)in_stack_fffffffffffff667) {
      local_6f0 = local_20;
      local_6e8 = local_28;
      in_stack_fffffffffffff658 = (ClientContext *)local_6e0;
      ::std::function<void(duckdb::CatalogEntry&)>::
      function<duckdb::Binder::BindCreateFunctionInfo(duckdb::CreateInfo&)::__0,void>
                ((function<void_(duckdb::CatalogEntry_&)> *)in_stack_fffffffffffff620,
                 (anon_class_16_2_da75149b *)in_stack_fffffffffffff618);
      ExpressionBinder::SetCatalogLookupCallback
                ((ExpressionBinder *)CONCAT17(in_stack_fffffffffffff657,in_stack_fffffffffffff650),
                 (catalog_entry_callback_t *)in_stack_fffffffffffff648);
      ::std::function<void_(duckdb::CatalogEntry_&)>::~function
                ((function<void_(duckdb::CatalogEntry_&)> *)0xdcdfe8);
    }
    ErrorData::ErrorData((ErrorData *)in_stack_fffffffffffff610);
    ExpressionBinder::Bind
              (in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748,
               (bool)in_stack_fffffffffffff747);
    in_stack_fffffffffffff648 = &local_770;
    ErrorData::operator=((ErrorData *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
    ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff610);
    in_stack_fffffffffffff657 = ErrorData::HasError(in_stack_fffffffffffff648);
    if ((bool)in_stack_fffffffffffff657) break;
    in_stack_fffffffffffff62f = ErrorData::HasError(&local_770);
    if (((bool)in_stack_fffffffffffff62f) &&
       (in_stack_fffffffffffff620 = (ClientContext *)ErrorData::Type(&local_770),
       *(byte *)&((_Hashtable *)
                 &in_stack_fffffffffffff620->super_enable_shared_from_this<duckdb::ClientContext>)->
                 _M_buckets != 0x23)) {
      paVar9 = &local_8c1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8c0,anon_var_dwarf_3eb64fd + 9,paVar9);
      ErrorData::Throw((ErrorData *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
                       (string *)in_stack_fffffffffffff658);
    }
    ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff610);
    SelectBinder::~SelectBinder((SelectBinder *)0xdce320);
    BoundGroupInformation::~BoundGroupInformation
              ((BoundGroupInformation *)in_stack_fffffffffffff610);
    BoundSelectNode::~BoundSelectNode(in_stack_fffffffffffff610);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0xdce347);
    unique_ptr<duckdb::DummyBinding,_std::default_delete<duckdb::DummyBinding>,_true>::~unique_ptr
              ((unique_ptr<duckdb::DummyBinding,_std::default_delete<duckdb::DummyBinding>,_true> *)
               0xdce354);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0xdce361);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdce36e);
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>_>
    ::operator++(&local_78);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_810,anon_var_dwarf_3eb64fd + 9,&local_811);
  ErrorData::Throw((ErrorData *)CONCAT17(in_stack_fffffffffffff667,in_stack_fffffffffffff660),
                   (string *)in_stack_fffffffffffff658);
}

Assistant:

SchemaCatalogEntry &Binder::BindCreateFunctionInfo(CreateInfo &info) {
	auto &base = info.Cast<CreateMacroInfo>();

	auto &dependencies = base.dependencies;
	auto &catalog = Catalog::GetCatalog(context, info.catalog);
	auto &db_config = DBConfig::GetConfig(context);
	// try to bind each of the included functions
	unordered_set<idx_t> positional_parameters;
	for (auto &function : base.macros) {
		auto &scalar_function = function->Cast<ScalarMacroFunction>();
		if (scalar_function.expression->HasParameter()) {
			throw BinderException("Parameter expressions within macro's are not supported!");
		}
		vector<LogicalType> dummy_types;
		vector<string> dummy_names;
		auto parameter_count = function->parameters.size();
		if (positional_parameters.find(parameter_count) != positional_parameters.end()) {
			throw BinderException(
			    "Ambiguity in macro overloads - macro \"%s\" has multiple definitions with %llu parameters", base.name,
			    parameter_count);
		}
		positional_parameters.insert(parameter_count);

		// positional parameters
		for (auto &param_expr : function->parameters) {
			auto param = param_expr->Cast<ColumnRefExpression>();
			if (param.IsQualified()) {
				throw BinderException("Invalid parameter name '%s': must be unqualified", param.ToString());
			}
			dummy_types.emplace_back(LogicalType::UNKNOWN);
			dummy_names.push_back(param.GetColumnName());
		}
		// default parameters
		for (auto &entry : function->default_parameters) {
			auto &val = entry.second->Cast<ConstantExpression>();
			dummy_types.push_back(val.value.type());
			dummy_names.push_back(entry.first);
		}
		auto this_macro_binding = make_uniq<DummyBinding>(dummy_types, dummy_names, base.name);
		macro_binding = this_macro_binding.get();

		// create a copy of the expression because we do not want to alter the original
		auto expression = scalar_function.expression->Copy();
		ExpressionBinder::QualifyColumnNames(*this, expression);

		// bind it to verify the function was defined correctly
		BoundSelectNode sel_node;
		BoundGroupInformation group_info;
		SelectBinder binder(*this, context, sel_node, group_info);
		bool should_create_dependencies = db_config.GetSetting<EnableMacroDependenciesSetting>(context);

		if (should_create_dependencies) {
			binder.SetCatalogLookupCallback([&dependencies, &catalog](CatalogEntry &entry) {
				if (&catalog != &entry.ParentCatalog()) {
					// Don't register any cross-catalog dependencies
					return;
				}
				// Register any catalog entry required to bind the macro function
				dependencies.AddDependency(entry);
			});
		}
		ErrorData error;
		try {
			error = binder.Bind(expression, 0, false);
			if (error.HasError()) {
				error.Throw();
			}
		} catch (const std::exception &ex) {
			error = ErrorData(ex);
		}
		// if we cannot resolve parameters we postpone binding until the macro function is used
		if (error.HasError() && error.Type() != ExceptionType::PARAMETER_NOT_RESOLVED) {
			error.Throw();
		}
	}

	return BindCreateSchema(info);
}